

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiLineEntry.cpp
# Opt level: O2

void __thiscall cursespp::MultiLineEntry::SetWidth(MultiLineEntry *this,size_t width)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_28;
  
  if (width != 0) {
    if (this->width != width) {
      this->width = width;
      text::BreakLines(&vStack_28,&this->value,width);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&this->lines,&vStack_28);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_28);
    }
  }
  return;
}

Assistant:

void MultiLineEntry::SetWidth(size_t width) {
    if (this->width != width && width > 0) {
        this->width = width;
        this->lines = text::BreakLines(this->value, this->width);
    }
}